

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4s.c
# Opt level: O0

void streamStateFree(roslz4_stream *str)

{
  void *__ptr;
  long in_RDI;
  stream_state *state;
  void *in_stack_ffffffffffffffe8;
  
  __ptr = *(void **)(in_RDI + 0x28);
  if (__ptr != (void *)0x0) {
    if (*(long *)((long)__ptr + 0x10) != 0) {
      free(*(void **)((long)__ptr + 0x10));
    }
    if (*(long *)((long)__ptr + 0x28) != 0) {
      XXH32_digest(in_stack_ffffffffffffffe8);
    }
    free(__ptr);
    *(undefined8 *)(in_RDI + 0x28) = 0;
  }
  return;
}

Assistant:

void streamStateFree(roslz4_stream *str) {
  stream_state *state = str->state;
  if (state != NULL) {
    if (state->buffer != NULL) {
      free(state->buffer);
    }
    if (state->xxh32_state != NULL) {
      XXH32_digest(state->xxh32_state);
    }
    free(state);
    str->state = NULL;
  }
}